

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  rep rVar2;
  type this;
  long in_RSI;
  undefined1 *__stat_loc;
  int in_EDI;
  time_point end_1;
  Executor executor;
  Taskflow taskflow;
  time_point beg_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings_1;
  time_point end;
  time_point beg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcb8;
  Taskflow *in_stack_fffffffffffffcc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffcc8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffcd0;
  Taskflow *in_stack_fffffffffffffce0;
  Executor *in_stack_fffffffffffffcf0;
  FlowBuilder *in_stack_fffffffffffffcf8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd08;
  duration<long,_std::ratio<1L,_1000L>_> local_2e0;
  undefined8 local_2d8;
  __basic_future<void> local_2d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  undefined1 local_288 [48];
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffda8;
  size_t in_stack_fffffffffffffdb0;
  Executor *in_stack_fffffffffffffdb8;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  undefined8 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  undefined8 local_40;
  long local_10;
  undefined4 local_4;
  
  local_4 = 0;
  if (in_EDI != 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ./parallel_sort s|p");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if (**(char **)(in_RSI + 8) == 's') {
    random_strings_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,"std::sort ... ");
    local_40 = std::chrono::_V2::steady_clock::now();
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(in_stack_fffffffffffffcb8);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffffcb8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_58 = std::chrono::_V2::steady_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffcc8._M_current,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffcc0);
    local_60.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   in_stack_fffffffffffffcb8);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_60);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,rVar2);
    std::operator<<(poVar1," ms\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffcd0._M_current);
  }
  else {
    if (**(char **)(in_RSI + 8) != 'p') {
      local_10 = in_RSI;
      poVar1 = std::operator<<((ostream *)&std::cerr,"uncognized method character \'");
      poVar1 = std::operator<<(poVar1,**(char **)(local_10 + 8));
      std::operator<<(poVar1,"\'\n");
      exit(1);
    }
    random_strings_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,"Taskflow Parallel Sort ... ");
    std::chrono::_V2::steady_clock::now();
    tf::Taskflow::Taskflow(in_stack_fffffffffffffce0);
    std::thread::hardware_concurrency();
    std::shared_ptr<tf::WorkerInterface>::shared_ptr
              ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
    tf::Executor::Executor
              (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x105ddd);
    local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(in_stack_fffffffffffffcb8);
    local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffcb8);
    tf::FlowBuilder::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (in_stack_fffffffffffffcf8,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    __stat_loc = local_288;
    tf::Executor::run((Executor *)in_stack_fffffffffffffcc8._M_current,in_stack_fffffffffffffcc0);
    std::__basic_future<void>::wait(local_2d0,__stat_loc);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffcc0);
    tf::Executor::~Executor(in_stack_fffffffffffffcf0);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffcc0);
    local_2d8 = std::chrono::_V2::steady_clock::now();
    this = std::chrono::operator-
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffffcc8._M_current,
                      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffffcc0);
    local_2e0.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffcb8);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_2e0);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,rVar2);
    std::operator<<(poVar1," ms\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this.__r);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  if(argc != 2) {
    std::cerr << "usage: ./parallel_sort s|p" << std::endl;
    std::exit(EXIT_FAILURE);
  }

  // sequential sort
  if(argv[1][0] == 's') {
    auto strings = random_strings();
    std::cout << "std::sort ... ";
    auto beg = std::chrono::steady_clock::now();
    std::sort(strings.begin(), strings.end());
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(end-beg).count()
              << " ms\n";
  }
  // parallel sort
  else if(argv[1][0] == 'p') {
    auto strings = random_strings();
    std::cout << "Taskflow Parallel Sort ... ";
    auto beg = std::chrono::steady_clock::now();
    {
      tf::Taskflow taskflow;
      tf::Executor executor;
      taskflow.sort(strings.begin(), strings.end());
      executor.run(taskflow).wait();
    }
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(end-beg).count()
              << " ms\n";
  }
  else {
    std::cerr << "uncognized method character '" << argv[1][0] << "'\n";
    std::exit(EXIT_FAILURE);
  }

  return 0;
}